

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

void __thiscall
HighsHashTree<int,_void>::InnerLeaf<4>::move_backward(InnerLeaf<4> *this,int *first,int *last)

{
  int iVar1;
  int iVar2;
  difference_type __d;
  long lVar3;
  
  iVar1 = *first;
  iVar2 = *last;
  if (iVar2 != iVar1) {
    lVar3 = (long)iVar2 - (long)iVar1;
    memmove((void *)((long)this + lVar3 * -4 + (long)iVar2 * 4 + 0x1cc),
            (this->entries)._M_elems + iVar1,lVar3 * 4);
  }
  lVar3 = (long)*first;
  memmove((this->hashes)._M_elems + lVar3 + 1,(this->hashes)._M_elems + lVar3,(*last - lVar3) * 8);
  return;
}

Assistant:

void move_backward(const int& first, const int& last) {
      // move elements backwards
      std::move_backward(std::next(entries.begin(), first),
                         std::next(entries.begin(), last),
                         std::next(entries.begin(), last + 1));
      memmove(&hashes[first + 1], &hashes[first],
              sizeof(hashes[0]) * (last - first));
    }